

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  testing::FLAGS_gtest_catch_exceptions = 0;
  argv_local._0_4_ = argc;
  std::__cxx11::string::operator=
            ((string *)testing::FLAGS_gtest_death_test_style_abi_cxx11_,"threadsafe");
  testing::InitGoogleTest((int *)&argv_local,argv);
  iVar1 = RUN_ALL_TESTS();
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
    ::testing::GTEST_FLAG(catch_exceptions) = false;
    ::testing::GTEST_FLAG(death_test_style) = "threadsafe";
    //::testing::GTEST_FLAG(filter) = "RecoveryTest.AccessViolationTest";

    ::testing::InitGoogleTest(&argc, argv);
    return RUN_ALL_TESTS();
}